

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

const_iterator __thiscall
frozen::
unordered_map<std::basic_string_view<char,std::char_traits<char>>,bool,37ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
::
find<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
          (unordered_map<std::basic_string_view<char,std::char_traits<char>>,bool,37ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *key,
          elsa<std::basic_string_view<char,_std::char_traits<char>_>_> *hash,
          equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *equal)

{
  const_iterator this_00;
  size_t __n;
  int iVar1;
  size_t sVar2;
  const_iterator pvVar3;
  
  this_00 = (const_iterator)(this + 0x380);
  sVar2 = bits::pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>::
          lookup<std::basic_string_view<char,std::char_traits<char>>,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                    ((pmh_tables<64ul,frozen::elsa<std::basic_string_view<char,std::char_traits<char>>>>
                      *)this_00,key,hash);
  __n = *(size_t *)(this + sVar2 * 0x18 + 8);
  pvVar3 = this_00;
  if (((__n == key->_M_len) && (pvVar3 = (const_iterator)(this + sVar2 * 0x18 + 8), __n != 0)) &&
     (iVar1 = bcmp(*(void **)(this + sVar2 * 0x18 + 0x10),key->_M_str,__n), pvVar3 = this_00,
     iVar1 == 0)) {
    pvVar3 = (const_iterator)(this + sVar2 * 0x18 + 8);
  }
  return pvVar3;
}

Assistant:

constexpr const_iterator find(KeyType const &key, Hasher const &hash, Equal const &equal) const {
    return find_impl(*this, key, hash, equal);
  }